

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O3

void __thiscall tst_qpromise_resolve::value(tst_qpromise_resolve *this)

{
  int *piVar1;
  QSharedData *pQVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  PromiseDataBase<void,_void_()> *this_00;
  undefined **ppuVar7;
  char *reject;
  QSharedData *pQVar8;
  long lVar9;
  PromiseDataBase<int,_void_(const_int_&)> *pPVar10;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_150;
  Data *local_148;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_138;
  Data *pDStack_130;
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined **local_118;
  PromiseData<int> *local_110;
  undefined **local_108;
  PromiseData<int> *local_100;
  undefined **local_f8;
  PromiseData<int> *local_f0;
  undefined **local_e8;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<void> local_c0;
  QPromise<int> p0;
  int v1;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  int v0;
  _Any_data local_50;
  code *local_40;
  
  v0 = 0x2a;
  v1 = 0x2a;
  local_118 = (undefined **)CONCAT44(local_118._4_4_,0x2a);
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&p0.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&local_118);
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a8c0;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&p1.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&v0);
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a8c0;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&p2.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&v1);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a8c0;
  local_110 = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = &PTR__QPromiseBase_0011a8c0;
  local_100 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108 = &PTR__QPromiseBase_0011a8c0;
  local_f0 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8 = &PTR__QPromiseBase_0011a8c0;
  local_f8 = &PTR__QPromiseBase_0011a8c0;
  lVar9 = 8;
  do {
    pPVar10 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_118 + lVar9);
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(pPVar10);
    bVar3 = (bool)(~bVar3 & (pPVar10->m_error).m_data._M_exception_object == (void *)0x0);
    local_98._M_pod_data[0] = bVar3;
    local_50._M_pod_data[0] = '\x01';
    pcVar5 = QTest::toString<bool>((bool *)local_98._M_pod_data);
    pcVar6 = QTest::toString<bool>((bool *)local_50._M_pod_data);
    reject = "p.isFulfilled()";
    bVar4 = QTest::compare_helper
                      (bVar3,"Compared values are not the same",pcVar5,pcVar6,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                       ,0x2e);
    bVar3 = lVar9 != 0x28;
    lVar9 = lVar9 + 0x10;
  } while ((bVar4 & bVar3) != 0);
  lVar9 = 0x30;
  do {
    *(undefined ***)((long)&local_128 + lVar9) = &PTR__QPromiseBase_0011a6f8;
    if (*(long *)((long)&uStack_120 + lVar9) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)((long)&uStack_120 + lVar9) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (*(long **)((long)&uStack_120 + lVar9) != (long *)0x0)) {
        (**(code **)(**(long **)((long)&uStack_120 + lVar9) + 8))();
      }
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != 0);
  if (bVar4 != 0) {
    local_110 = p0.super_QPromiseBase<int>.m_d.d;
    if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar8 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118 = local_e8;
    local_100 = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar8 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108 = local_e8;
    local_f0 = p2.super_QPromiseBase<int>.m_d.d;
    if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar8 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_f8 = local_e8;
    local_60 = (_func_int **)&PTR__PromiseDataBase_0011a808;
    local_68 = (_func_int **)&PTR__PromiseDataBase_0011a790;
    ppuVar7 = &PTR__QPromiseBase_0011a770;
    local_70 = (_func_int **)&PTR__QPromiseBase_0011a728;
    lVar9 = 0;
    local_78 = (_func_int **)&PTR__QPromiseBase_0011a770;
    do {
      uStack_120._4_4_ = -1;
      this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
      this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&this_00->super_QSharedData = 0;
      (this_00->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_00->m_catchers).d.size = 0;
      (this_00->m_handlers).d.size = 0;
      (this_00->m_catchers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&this_00->m_lock = 0;
      *(undefined8 *)&this_00->m_settled = 0;
      (this_00->m_error).m_data._M_exception_object = (void *)0x0;
      this_00->_vptr_PromiseDataBase = local_60;
      QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
      this_00->m_settled = false;
      (this_00->m_handlers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (this_00->m_handlers).d.size = 0;
      (this_00->m_catchers).d.d = (Data *)0x0;
      (this_00->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_00->m_catchers).d.size = 0;
      (this_00->m_error).m_data._M_exception_object = (void *)0x0;
      this_00->_vptr_PromiseDataBase = local_68;
      LOCK();
      (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar8 = &this_00->super_QSharedData;
      LOCK();
      (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_c0.super_QPromiseBase<void>._vptr_QPromiseBase = local_70;
      local_c0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_c0);
      local_c0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)ppuVar7;
      if (&(local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
          (PromiseDataBase<void,_void_()> *)0x0) {
        LOCK();
        pQVar2 = &((local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (&(local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
            (PromiseDataBase<void,_void_()> *)0x0)) {
          (*((local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
            _vptr_PromiseDataBase[1])();
        }
      }
      local_e8 = (undefined **)((long)&local_118 + lVar9);
      if (resolver.m_d.d == (Data *)0x0) {
        pPVar10 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + lVar9);
        local_138.d = (Data *)0x0;
        pDStack_130 = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        if (resolver.m_d.d == (Data *)0x0) {
          local_150.d = (Data *)0x0;
          pPVar10 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + lVar9);
LAB_001049e4:
          local_138 = resolver.m_d.d;
          LOCK();
          *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
          UNLOCK();
          pDStack_130 = local_150.d;
          if (local_150.d == (Data *)0x0) goto LAB_001049f9;
        }
        else {
          LOCK();
          *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
          UNLOCK();
          local_150 = resolver.m_d.d;
          pPVar10 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + lVar9);
          if (resolver.m_d.d != (Data *)0x0) goto LAB_001049e4;
        }
        local_138 = resolver.m_d.d;
        LOCK();
        ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDStack_130 = local_150.d;
      }
LAB_001049f9:
      local_128 = (undefined1 *)((long)&uStack_120 + 4);
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (_Manager_type)0x0;
      p_Stack_80 = (_Invoker_type)0x0;
      local_150.d = pDStack_130;
      local_148 = local_138.d;
      local_98._M_unused._M_object = operator_new(0x18);
      *(Data **)local_98._M_unused._0_8_ = local_138.d;
      if (local_138.d != (Data *)0x0) {
        LOCK();
        ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)local_98._M_unused._0_8_ + 8) = pDStack_130;
      if (pDStack_130 == (Data *)0x0) {
        *(undefined1 **)((long)local_98._M_unused._0_8_ + 0x10) = local_128;
        p_Stack_80 = std::
                     _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_manager;
      }
      else {
        LOCK();
        (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        *(undefined1 **)((long)local_98._M_unused._0_8_ + 0x10) = local_128;
        p_Stack_80 = std::
                     _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_manager;
        if (pDStack_130 != (Data *)0x0) {
          LOCK();
          (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            operator_delete(pDStack_130,0x10);
          }
        }
      }
      if (local_138.d != (Data *)0x0) {
        LOCK();
        ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(local_138.d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (pPVar10,(function<void_(const_int_&)> *)&local_98);
      if (local_88 != (_Manager_type)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      pPVar10 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + lVar9);
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_148,
                 (QPromiseResolve<void> *)&local_150,(QPromiseReject<void> *)reject);
      ppuVar7 = local_78;
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (pPVar10,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_150.d != (Data *)0x0) {
        LOCK();
        ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            ((local_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
          operator_delete(local_150.d,0x10);
        }
      }
      if (local_148 != (Data *)0x0) {
        LOCK();
        (local_148->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (local_148->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_148->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(local_148,0x10);
        }
      }
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver.m_d.d == 0) {
          operator_delete((void *)resolver.m_d.d,0x10);
        }
      }
      bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        ((PromiseDataBase<int,_void_(const_int_&)> *)local_e8[1]);
      if (!bVar3) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  ((PromiseDataBase<int,_void_(const_int_&)> *)local_e8[1]);
      }
      bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      while (bVar3 != false) {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      }
      LOCK();
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_PromiseDataBase[1])(this_00);
      }
      LOCK();
      (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_PromiseDataBase[1])(this_00);
      }
      reject = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
      ;
      bVar4 = QTest::qCompare(uStack_120._4_4_,0x2a,"waitForValue(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                              ,0x31);
      lVar9 = lVar9 + 0x10;
    } while ((bVar4 & lVar9 != 0x30) != 0);
    lVar9 = 0x30;
    do {
      *(undefined ***)((long)&local_128 + lVar9) = &PTR__QPromiseBase_0011a6f8;
      if (*(long *)((long)&uStack_120 + lVar9) != 0) {
        LOCK();
        piVar1 = (int *)(*(long *)((long)&uStack_120 + lVar9) + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (*(long **)((long)&uStack_120 + lVar9) != (long *)0x0)) {
          (**(code **)(**(long **)((long)&uStack_120 + lVar9) + 8))();
        }
      }
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != 0);
  }
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a6f8;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a6f8;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a6f8;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar8 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_resolve::value()
{
    int v0 = 42;
    const int v1 = 42;

    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(v0);
    auto p2 = QtPromise::QPromise<int>::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<int>>::value));

    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(p.isFulfilled(), true);
    }
    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(waitForValue(p, -1), 42);
    }
}